

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O0

void __thiscall HBT_correlation::~HBT_correlation(HBT_correlation *this)

{
  ParameterReader *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  double ******in_stack_00000018;
  double ***in_stack_ffffffffffffffe8;
  HBT_correlation *in_stack_fffffffffffffff0;
  ParameterReader *pPVar1;
  int n3;
  
  pPVar1 = in_RDI;
  if (*(int *)((long)&in_RDI[10].values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 4) == 1) {
    delete_a_2D_array<double>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,(int)((ulong)in_RDI >> 0x20));
    delete_a_2D_array<double>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,(int)((ulong)in_RDI >> 0x20));
    delete_a_2D_array<double>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,(int)((ulong)in_RDI >> 0x20));
    delete_a_2D_array<double>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,(int)((ulong)in_RDI >> 0x20));
  }
  n3 = (int)((ulong)pPVar1 >> 0x20);
  if (*(int *)&in_RDI[10].values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage == 0) {
    delete_a_4D_array<double>
              ((HBT_correlation *)CONCAT44(in_stack_00000014,in_stack_00000010),
               (double *****)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr_00,
               unaff_retaddr,n3);
    delete_a_4D_array<double>
              ((HBT_correlation *)CONCAT44(in_stack_00000014,in_stack_00000010),
               (double *****)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr_00,
               unaff_retaddr,n3);
    delete_a_4D_array<double>
              ((HBT_correlation *)CONCAT44(in_stack_00000014,in_stack_00000010),
               (double *****)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr_00,
               unaff_retaddr,n3);
    delete_a_4D_array<double>
              ((HBT_correlation *)CONCAT44(in_stack_00000014,in_stack_00000010),
               (double *****)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr_00,
               unaff_retaddr,n3);
    delete_a_4D_array<double>
              ((HBT_correlation *)CONCAT44(in_stack_00000014,in_stack_00000010),
               (double *****)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr_00,
               unaff_retaddr,n3);
    delete_a_4D_array<double>
              ((HBT_correlation *)CONCAT44(in_stack_00000014,in_stack_00000010),
               (double *****)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr_00,
               unaff_retaddr,n3);
  }
  else {
    delete_a_5D_array<double>
              (this,in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
               in_stack_00000008);
    delete_a_5D_array<double>
              (this,in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
               in_stack_00000008);
    delete_a_5D_array<double>
              (this,in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
               in_stack_00000008);
    delete_a_5D_array<double>
              (this,in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
               in_stack_00000008);
    delete_a_5D_array<double>
              (this,in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
               in_stack_00000008);
    delete_a_5D_array<double>
              (this,in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
               in_stack_00000008);
  }
  if (*(int *)&in_RDI[10].values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage == 1) {
    delete_a_2D_array<unsigned_long_long>
              (in_stack_fffffffffffffff0,(unsigned_long_long ***)in_stack_ffffffffffffffe8,
               (int)((ulong)in_RDI >> 0x20));
    delete_a_2D_array<unsigned_long_long>
              (in_stack_fffffffffffffff0,(unsigned_long_long ***)in_stack_ffffffffffffffe8,
               (int)((ulong)in_RDI >> 0x20));
  }
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffffff0);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffffff0);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffffff0);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffffff0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffff0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffff0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffff0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffff0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffff0);
  pretty_ostream::~pretty_ostream((pretty_ostream *)0x15775c);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x15776a);
  std::shared_ptr<particleSamples>::~shared_ptr((shared_ptr<particleSamples> *)0x157778);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  ParameterReader::~ParameterReader(in_RDI);
  return;
}

Assistant:

HBT_correlation::~HBT_correlation() {
    if (invariant_radius_flag_ == 1) {
        delete_a_2D_array(q_inv_mean, n_KT);
        delete_a_2D_array(correl_1d_inv_num, n_KT);
        delete_a_2D_array(correl_1d_inv_num_count, n_KT);
        delete_a_2D_array(correl_1d_inv_denorm, n_KT);
    }

    if (azimuthal_flag_ == 0) {
        delete_a_4D_array(q_out_mean, n_KT, qnpts, qnpts);
        delete_a_4D_array(q_side_mean, n_KT, qnpts, qnpts);
        delete_a_4D_array(q_long_mean, n_KT, qnpts, qnpts);
        delete_a_4D_array(correl_3d_num, n_KT, qnpts, qnpts);
        delete_a_4D_array(correl_3d_num_count, n_KT, qnpts, qnpts);
        delete_a_4D_array(correl_3d_denorm, n_KT, qnpts, qnpts);
    } else {
        delete_a_5D_array(q_out_diff_mean, n_KT, n_Kphi, qnpts, qnpts);
        delete_a_5D_array(q_side_diff_mean, n_KT, n_Kphi, qnpts, qnpts);
        delete_a_5D_array(q_long_diff_mean, n_KT, n_Kphi, qnpts, qnpts);
        delete_a_5D_array(correl_3d_Kphi_diff_num, n_KT, n_Kphi, qnpts, qnpts);
        delete_a_5D_array(
            correl_3d_Kphi_diff_num_count, n_KT, n_Kphi, qnpts, qnpts);
        delete_a_5D_array(
            correl_3d_Kphi_diff_denorm, n_KT, n_Kphi, qnpts, qnpts);
    }

    if (azimuthal_flag_ == 1) {
        delete_a_2D_array(number_of_pairs_numerator_KTKphidiff, n_KT);
        delete_a_2D_array(number_of_pairs_denormenator_KTKphidiff, n_KT);
    }
}